

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

Builder * __thiscall
capnp::_::OrphanBuilder::asText(Builder *__return_storage_ptr__,OrphanBuilder *this)

{
  OrphanBuilder *pOVar1;
  byte bVar2;
  SegmentId id;
  uint uVar3;
  uint uVar4;
  int iVar5;
  SegmentBuilder *this_00;
  word *pwVar6;
  ulong uVar7;
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> _kjCondition;
  Fault f;
  
  uVar3 = (uint)(this->tag).content;
  id.value = *(uint *)((long)&(this->tag).content + 4);
  if (id.value != 0 || uVar3 != 0) {
    this_00 = this->segment;
    if ((uVar3 & 3) == 2) {
      this_00 = BuilderArena::getSegment((BuilderArena *)(this_00->super_SegmentReader).arena,id);
      uVar3 = (uint)(this->tag).content;
      pwVar6 = (this_00->super_SegmentReader).ptr.ptr;
      uVar7 = (ulong)(uVar3 & 0xfffffff8);
      pOVar1 = (OrphanBuilder *)((long)&pwVar6->content + uVar7);
      this = (OrphanBuilder *)((long)&pwVar6[1].content + uVar7);
      if ((uVar3 & 4) == 0) {
        pwVar6 = &this->tag + ((int)(pOVar1->tag).content >> 2);
        this = pOVar1;
      }
      else {
        this_00 = BuilderArena::getSegment
                            ((BuilderArena *)(this_00->super_SegmentReader).arena,
                             (SegmentId)*(uint *)((long)&(pOVar1->tag).content + 4));
        pwVar6 = (word *)((long)&((this_00->super_SegmentReader).ptr.ptr)->content +
                         (ulong)((uint)(pOVar1->tag).content & 0xfffffff8));
      }
    }
    else {
      pwVar6 = this->location;
    }
    if (this_00->readOnly == true) {
      SegmentBuilder::throwNotWritable(this_00);
    }
    _kjCondition.left = (Kind)(this->tag).content & OTHER;
    _kjCondition.right = LIST;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = _kjCondition.left == LIST;
    if (_kjCondition.left == LIST) {
      bVar2 = *(byte *)((long)&(this->tag).content + 4);
      _kjCondition._0_8_ = CONCAT71(_kjCondition._1_7_,bVar2) & 0xffffffffffffff07;
      _kjCondition.left._1_1_ = 2;
      _kjCondition.op.content.ptr = " == ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = (bVar2 & 7) == 2;
      if (_kjCondition.result) {
        uVar3 = *(uint *)((long)&(this->tag).content + 4);
        uVar4 = (uVar3 >> 3) - 1;
        if (uVar3 < 8) {
          uVar4 = 0;
        }
        uVar7 = (ulong)uVar4;
        if (uVar3 < 8) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51]>
                    ((Fault *)&_kjCondition,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x6a3,FAILED,(char *)0x0,
                     "\"zero-size blob can\'t be text (need NUL terminator)\"",
                     (char (*) [51])"zero-size blob can\'t be text (need NUL terminator)");
          kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
          iVar5 = 2;
        }
        else {
          _kjCondition._0_8_ = (long)&pwVar6->content + uVar7;
          _kjCondition.op.content.ptr = "2";
          _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_22597;
          _kjCondition.result = true;
          _kjCondition._25_7_ = 0;
          if (*(char *)((long)&pwVar6->content + uVar7) == '\0') {
            (__return_storage_ptr__->content).ptr = (char *)pwVar6;
            (__return_storage_ptr__->content).size_ = uVar7 + 1;
            iVar5 = 1;
          }
          else {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_char&,char>&,char_const(&)[34]>
                      (&f,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x69d,FAILED,"*(bptr + size) == \'\\0\'",
                       "_kjCondition,\"Text blob missing NUL terminator.\"",
                       (DebugComparison<unsigned_char_&,_char> *)&_kjCondition,
                       (char (*) [34])"Text blob missing NUL terminator.");
            kj::_::Debug::Fault::~Fault(&f);
            iVar5 = 2;
          }
        }
      }
      else {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::ElementSize,capnp::ElementSize>&,char_const(&)[94]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x696,FAILED,"ref->listRef.elementSize() == ElementSize::BYTE",
                   "_kjCondition,\"Schema mismatch: Called getText{Field,Element}() but existing list pointer is not \" \"byte-sized.\""
                   ,(DebugComparison<capnp::ElementSize,_capnp::ElementSize> *)&_kjCondition,
                   (char (*) [94])
                   "Schema mismatch: Called getText{Field,Element}() but existing list pointer is not byte-sized."
                  );
        kj::_::Debug::Fault::~Fault(&f);
        iVar5 = 2;
      }
    }
    else {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[85]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x691,FAILED,"ref->kind() == WirePointer::LIST",
                 "_kjCondition,\"Schema mismatch: Called getText{Field,Element}() but existing pointer is not a list.\""
                 ,&_kjCondition,
                 (char (*) [85])
                 "Schema mismatch: Called getText{Field,Element}() but existing pointer is not a list."
                );
      kj::_::Debug::Fault::~Fault(&f);
      iVar5 = 2;
    }
    if (iVar5 != 2) {
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->content).ptr = &Text::Builder::nulstr;
  (__return_storage_ptr__->content).size_ = 1;
  return __return_storage_ptr__;
}

Assistant:

Text::Builder OrphanBuilder::asText() {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));

  // Never relocates.
  return WireHelpers::getWritableTextPointer(
      tagAsPtr(), location, segment, capTable, nullptr, ZERO * BYTES);
}